

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

ssize_t Curl_h1_req_parse_read
                  (h1_req_parser *parser,char *buf,size_t buflen,char *scheme_default,int options,
                  CURLcode *err)

{
  dynbuf *s;
  char *__src;
  long lVar1;
  ulong __n;
  char cVar2;
  CURLcode CVar3;
  int iVar4;
  CURLUcode CVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *p_len;
  size_t s_len;
  long lVar10;
  char *__n_00;
  char *authority;
  long lVar11;
  ulong __n_01;
  size_t sVar12;
  char *path;
  CURLcode local_2098;
  CURLU *local_2090;
  ssize_t local_2088;
  undefined8 local_2040;
  char local_2038 [8200];
  
  *err = CURLE_OK;
  if (parser->done == false) {
    s = &parser->scratch;
    lVar10 = 0;
    do {
      if (parser->line != (char *)0x0) {
        parser->line = (char *)0x0;
        parser->line_len = 0;
        Curl_dyn_reset(s);
      }
      pvVar6 = memchr(buf,10,buflen);
      if (pvVar6 == (void *)0x0) {
        *err = CURLE_AGAIN;
        CVar3 = Curl_dyn_addn(s,buf,buflen);
        *err = CVar3;
        if ((CVar3 != CURLE_OK) || (sVar12 = buflen, (long)buflen < 0)) {
LAB_001377ca:
          local_2088 = -1;
          if (CVar3 == CURLE_AGAIN) {
            local_2088 = lVar10;
          }
          local_2098 = CURLE_OK;
          goto LAB_00137828;
        }
      }
      else {
        parser->line = buf;
        sVar12 = ((long)pvVar6 - (long)buf) + 1;
        parser->line_len = sVar12;
        *err = CURLE_OK;
        local_2088 = -1;
        local_2098 = CURLE_OK;
        if ((long)pvVar6 - (long)buf < -1) goto LAB_00137828;
        sVar7 = Curl_dyn_len(s);
        sVar9 = parser->line_len;
        if (sVar7 != 0) {
          CVar3 = Curl_dyn_addn(s,parser->line,sVar9);
          *err = CVar3;
          if (CVar3 != CURLE_OK) goto LAB_001377ca;
          pcVar8 = Curl_dyn_ptr(s);
          parser->line = pcVar8;
          sVar9 = Curl_dyn_len(s);
          parser->line_len = sVar9;
        }
        if (sVar9 == 0) {
LAB_001374d8:
          if ((options & 1U) != 0) goto LAB_00137828;
        }
        else {
          cVar2 = parser->line[sVar9 - 1];
          sVar7 = sVar9;
          if (cVar2 == '\n') {
            sVar7 = sVar9 - 1;
            parser->line_len = sVar7;
            if (sVar7 == 0) goto LAB_001374d8;
            cVar2 = parser->line[sVar9 - 2];
          }
          if (cVar2 == '\r') {
            sVar7 = sVar7 - 1;
            parser->line_len = sVar7;
          }
          else if ((options & 1U) != 0) goto LAB_00137828;
          if (parser->max_line_len < sVar7) goto LAB_00137828;
        }
        *err = CURLE_OK;
      }
      lVar10 = lVar10 + sVar12;
      buflen = buflen - sVar12;
      pcVar8 = parser->line;
      if (pcVar8 == (char *)0x0) {
        if (buflen == 0) {
          return lVar10;
        }
      }
      else {
        __n = parser->line_len;
        if (parser->req == (httpreq *)0x0) {
          local_2090 = (CURLU *)0x0;
          local_2040 = buf;
          pvVar6 = memchr(pcVar8,0x20,__n);
          buf = local_2040;
          local_2098 = CURLE_URL_MALFORMAT;
          if (((pvVar6 != (void *)0x0) && (__n_01 = (long)pvVar6 - (long)pcVar8, __n_01 != 0)) &&
             (__n_01 < __n)) {
            __src = (char *)((long)pvVar6 + 1);
            lVar11 = 0;
            while (pcVar8[lVar11 + __n] != ' ') {
              lVar1 = __n + lVar11;
              lVar11 = lVar11 + -1;
              if (lVar1 - 1U <= __n_01) goto LAB_00137811;
            }
            if (lVar11 != 0) {
              lVar1 = __n - (long)pvVar6;
              __n_00 = pcVar8 + lVar11 + lVar1 + -1;
              if (__n_00 != (char *)0x0) {
                if ((pcVar8 + lVar11 + lVar1 == (char *)0x2) && (*__src == '*')) {
                  __n_00 = (char *)0x1;
LAB_00137737:
                  p_len = __n_00;
                  __n_00 = (char *)0x0;
                  authority = (char *)0x0;
                  path = __src;
LAB_0013773a:
                  if (scheme_default == (char *)0x0) {
                    s_len = 0;
                  }
                  else {
                    s_len = strlen(scheme_default);
                  }
                  CVar3 = Curl_http_req_make(&parser->req,pcVar8,__n_01,scheme_default,s_len,
                                             authority,(size_t)__n_00,path,(size_t)p_len);
                  local_2090 = (CURLU *)0x0;
                }
                else {
                  iVar4 = strncmp("CONNECT",pcVar8,__n_01);
                  if (iVar4 == 0) {
                    p_len = (char *)0x0;
                    path = (char *)0x0;
                    authority = __src;
                    goto LAB_0013773a;
                  }
                  if (*__src == '/') goto LAB_00137737;
                  local_2098 = CURLE_URL_MALFORMAT;
                  if ((char *)0x1fff < __n_00) {
LAB_001377f8:
                    local_2090 = (CURLU *)0x0;
                    goto LAB_00137811;
                  }
                  memcpy(local_2038,__src,(size_t)__n_00);
                  pcVar8[(long)(local_2038 + lVar11 + lVar1 + -1)] = '\0';
                  sVar9 = Curl_is_absolute_url(local_2038,(char *)0x0,0,false);
                  if (sVar9 == 0) {
                    if ((options & 1U) == 0) goto LAB_00137737;
                    goto LAB_001377f8;
                  }
                  local_2090 = curl_url();
                  if (local_2090 == (CURLU *)0x0) {
                    local_2098 = CURLE_OUT_OF_MEMORY;
                    goto LAB_001377f8;
                  }
                  CVar5 = curl_url_set(local_2090,CURLUPART_URL,local_2038,
                                       (uint)((options & 1U) == 0) << 0xb | 0x1a);
                  if (CVar5 != CURLUE_OK) {
                    local_2098 = CURLE_URL_MALFORMAT;
                    goto LAB_00137811;
                  }
                  CVar3 = Curl_http_req_make2(&parser->req,pcVar8,__n_01,local_2090,scheme_default);
                }
                curl_url_cleanup(local_2090);
                *err = CVar3;
                goto joined_r0x001377b9;
              }
            }
          }
LAB_00137811:
          curl_url_cleanup(local_2090);
          local_2088 = -1;
LAB_00137828:
          *err = local_2098;
          return local_2088;
        }
        if (__n == 0) {
          parser->done = true;
          Curl_dyn_reset(s);
          goto LAB_001377bb;
        }
        CVar3 = Curl_dynhds_h1_add_line(&parser->req->headers,pcVar8,__n);
        *err = CVar3;
joined_r0x001377b9:
        if (CVar3 != CURLE_OK) {
          return -1;
        }
      }
LAB_001377bb:
      buf = buf + sVar12;
    } while (parser->done == false);
  }
  else {
    lVar10 = 0;
  }
  return lVar10;
}

Assistant:

ssize_t Curl_h1_req_parse_read(struct h1_req_parser *parser,
                               const char *buf, size_t buflen,
                               const char *scheme_default, int options,
                               CURLcode *err)
{
  ssize_t nread = 0, n;

  *err = CURLE_OK;
  while(!parser->done) {
    n = next_line(parser, buf, buflen, options, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        nread = -1;
      }
      *err = CURLE_OK;
      goto out;
    }

    /* Consume this line */
    nread += (size_t)n;
    buf += (size_t)n;
    buflen -= (size_t)n;

    if(!parser->line) {
      /* consumed bytes, but line not complete */
      if(!buflen)
        goto out;
    }
    else if(!parser->req) {
      *err = start_req(parser, scheme_default, options);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
    else if(parser->line_len == 0) {
      /* last, empty line, we are finished */
      if(!parser->req) {
        *err = CURLE_URL_MALFORMAT;
        nread = -1;
        goto out;
      }
      parser->done = TRUE;
      Curl_dyn_reset(&parser->scratch);
      /* last chance adjustments */
    }
    else {
      *err = Curl_dynhds_h1_add_line(&parser->req->headers,
                                     parser->line, parser->line_len);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
  }

out:
  return nread;
}